

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read669.c
# Opt level: O1

int it_669_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,int tempo,int breakpoint,uchar *buffer,
                       int *used_channels)

{
  byte bVar1;
  int32 iVar2;
  int iVar3;
  IT_ENTRY *pIVar4;
  int iVar5;
  uchar *puVar6;
  long lVar7;
  int iVar8;
  byte bVar9;
  
  pattern->n_rows = 0x40;
  iVar2 = dumbfile_getnc((char *)buffer,0x600,f);
  iVar5 = -1;
  if (0x5ff < iVar2) {
    pattern->n_entries = (breakpoint < 0x3f) + 0x41;
    iVar3 = 0;
    puVar6 = buffer;
    do {
      lVar7 = 2;
      do {
        if ((puVar6[lVar7 + -2] != 0xff) || (puVar6[lVar7] != 0xff)) {
          pattern->n_entries = pattern->n_entries + 1;
        }
        lVar7 = lVar7 + 3;
      } while ((int)lVar7 != 0x1a);
      iVar3 = iVar3 + 1;
      puVar6 = puVar6 + 0x18;
    } while (iVar3 != 0x40);
    pIVar4 = (IT_ENTRY *)malloc((long)pattern->n_entries * 7);
    pattern->entry = pIVar4;
    if (pIVar4 != (IT_ENTRY *)0x0) {
      iVar5 = 0x40;
      if (breakpoint != 0x3f) {
        iVar5 = breakpoint;
      }
      pIVar4->channel = '\b';
      pIVar4->mask = '\b';
      pIVar4->effect = '\x01';
      pIVar4->effectvalue = (uchar)tempo;
      iVar3 = 0;
      lVar7 = 0;
      do {
        if (iVar3 == iVar5) {
          pIVar4[1].channel = '\b';
          pIVar4[1].mask = '\b';
          pIVar4[1].effect = '\x03';
          pIVar4[1].effectvalue = '\0';
          pIVar4 = pIVar4 + 2;
        }
        else {
          pIVar4 = pIVar4 + 1;
        }
        lVar7 = (long)(int)lVar7;
        iVar8 = 0;
        do {
          if ((buffer[lVar7] == 0xff) && (buffer[lVar7 + 2] == 0xff)) goto LAB_005b03d3;
          pIVar4->channel = (uchar)iVar8;
          pIVar4->mask = '\0';
          if (buffer[lVar7] < 0xfe) {
            pIVar4->mask = '\x03';
            pIVar4->note = (buffer[lVar7] >> 2) + 0x24;
            pIVar4->instrument = ((buffer[lVar7] & 3) << 4 | buffer[lVar7 + 1] >> 4) + 1;
          }
          if (buffer[lVar7] != 0xff) {
            pIVar4->mask = pIVar4->mask | 4;
            pIVar4->volpan = (uchar)((buffer[lVar7 + 1] & 0xf) * 0x44480 >> 0x10);
            if (*used_channels <= iVar8) {
              *used_channels = iVar8 + 1;
            }
          }
          if (buffer[lVar7 + 2] == 0xff) goto LAB_005b03cf;
          bVar1 = pIVar4->mask;
          pIVar4->mask = bVar1 | 8;
          bVar9 = buffer[lVar7 + 2] & 0xf;
          pIVar4->effectvalue = bVar9;
          switch(buffer[lVar7 + 2] >> 4) {
          case '\0':
            pIVar4->effect = '\x06';
            break;
          case '\x01':
            pIVar4->effect = '\x05';
            break;
          case '\x02':
            pIVar4->effect = '\a';
            break;
          case '\x03':
            pIVar4->effect = '\x13';
            bVar9 = bVar9 + 0x28;
            goto LAB_005b03a4;
          case '\x04':
            pIVar4->effect = '\b';
            bVar9 = bVar9 | 0x10;
LAB_005b03a4:
            pIVar4->effectvalue = bVar9;
            break;
          case '\x05':
            if (bVar9 == 0) goto switchD_005b0383_default;
            pIVar4->effect = '\x01';
            break;
          default:
switchD_005b0383_default:
            pIVar4->mask = bVar1 & 0xf7;
          }
          if (*used_channels <= iVar8) {
            *used_channels = iVar8 + 1;
          }
LAB_005b03cf:
          pIVar4 = pIVar4 + 1;
LAB_005b03d3:
          lVar7 = lVar7 + 3;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 8);
        pIVar4->channel = 0xff;
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0x40);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int it_669_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, int tempo, int breakpoint, unsigned char *buffer, int * used_channels)
{
	int pos;
	int channel;
	int row;
	IT_ENTRY *entry;

	pattern->n_rows = 64;

    if (dumbfile_getnc((char *)buffer, 64 * 3 * 8, f) < 64 * 3 * 8)
		return -1;

	/* compute number of entries */
	pattern->n_entries = 64 + 1; /* Account for the row end markers, speed command */
	if (breakpoint < 63) pattern->n_entries++; /* and break to row 0 */

	pos = 0;
	for (row = 0; row < 64; row++) {
		for (channel = 0; channel < 8; channel++) {
			if (buffer[pos+0] != 0xFF || buffer[pos+2] != 0xFF)
				pattern->n_entries++;
			pos += 3;
		}
	}

	pattern->entry = malloc(pattern->n_entries * sizeof(*pattern->entry));
	if (!pattern->entry)
		return -1;

	if (breakpoint == 63) breakpoint++;

	entry = pattern->entry;

	entry->channel = 8;
	entry->mask = IT_ENTRY_EFFECT;
	entry->effect = IT_SET_SPEED;
	entry->effectvalue = tempo;
	entry++;

	pos = 0;
	for (row = 0; row < 64; row++) {

		if (row == breakpoint) {
			entry->channel = 8;
			entry->mask = IT_ENTRY_EFFECT;
			entry->effect = IT_BREAK_TO_ROW;
			entry->effectvalue = 0;
			entry++;
		}

		for (channel = 0; channel < 8; channel++) {
			if (buffer[pos+0] != 0xFF || buffer[pos+2] != 0xFF) {
				entry->channel = channel;
				entry->mask = 0;

				if (buffer[pos+0] < 0xFE) {
					entry->mask |= IT_ENTRY_NOTE | IT_ENTRY_INSTRUMENT;
					entry->note = (buffer[pos+0] >> 2) + 36;
					entry->instrument = (((buffer[pos+0] << 4) | (buffer[pos+1] >> 4)) & 0x3F) + 1;
				}
				if (buffer[pos+0] <= 0xFE) {
					entry->mask |= IT_ENTRY_VOLPAN;
					entry->volpan = ((buffer[pos+1] & 15) << 6) / 15;
					if (*used_channels < channel + 1) *used_channels = channel + 1;
				}
				if (buffer[pos+2] != 0xFF) {
					entry->mask |= IT_ENTRY_EFFECT;
					entry->effectvalue = buffer[pos+2] & 15;
					switch (buffer[pos+2] >> 4) {
						case 0:
							entry->effect = IT_PORTAMENTO_UP;
							break;
						case 1:
							entry->effect = IT_PORTAMENTO_DOWN;
							break;
						case 2:
							entry->effect = IT_TONE_PORTAMENTO;
							break;
						case 3:
							entry->effect = IT_S;
							entry->effectvalue += IT_S_FINETUNE * 16 + 8;
							break;
						case 4:
							entry->effect = IT_VIBRATO;
							// XXX speed unknown
							entry->effectvalue |= 0x10;
							break;
						case 5:
							if (entry->effectvalue) {
								entry->effect = IT_SET_SPEED;
							} else {
								entry->mask &= ~IT_ENTRY_EFFECT;
							}
							break;
#if 0
						/* dunno about this, really... */
						case 6:
							if (entry->effectvalue == 0) {
								entry->effect = IT_PANNING_SLIDE;
								entry->effectvalue = 0xFE;
							} else if (entry->effectvalue == 1) {
								entry->effect = IT_PANNING_SLIDE;
								entry->effectvalue = 0xEF;
							} else {
								entry->mask &= ~IT_ENTRY_EFFECT;
							}
							break;
#endif
						default:
							entry->mask &= ~IT_ENTRY_EFFECT;
							break;
					}
					if (*used_channels < channel + 1) *used_channels = channel + 1;
				}

				entry++;
			}
			pos += 3;
		}
		IT_SET_END_ROW(entry);
		entry++;
	}

	return 0;
}